

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptset.cpp
# Opt level: O1

UnicodeString * __thiscall icu_63::ScriptSet::displayScripts(ScriptSet *this,UnicodeString *dest)

{
  undefined4 srcLength;
  UScriptCode UVar1;
  bool bVar2;
  char *src;
  bool bVar3;
  int32_t scriptIndex;
  UScriptCode UVar4;
  bool bVar5;
  UnicodeString local_60;
  
  UVar4 = USCRIPT_COMMON;
  do {
    if ((this->bits[(uint)UVar4 >> 5] >> (UVar4 & USCRIPT_ORIYA) & 1) != 0) goto LAB_002061b9;
    UVar4 = UVar4 + USCRIPT_INHERITED;
  } while (UVar4 != (USCRIPT_MATHEMATICAL_NOTATION|USCRIPT_BLISSYMBOLS));
  UVar4 = USCRIPT_INVALID_CODE;
LAB_002061b9:
  if (USCRIPT_INVALID_CODE < UVar4) {
    bVar3 = false;
    do {
      if (bVar3) {
        local_60.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x20;
        UnicodeString::doAppend(dest,(UChar *)&local_60,0,1);
      }
      src = uscript_getShortName_63(UVar4);
      UnicodeString::UnicodeString(&local_60,src,-1,kInvariant);
      srcLength = local_60.fUnion.fFields.fLength;
      if (-1 < local_60.fUnion.fStackFields.fLengthAndFlags) {
        srcLength = (int)local_60.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      UnicodeString::doAppend(dest,&local_60,0,srcLength);
      UnicodeString::~UnicodeString(&local_60);
      UVar1 = USCRIPT_INVALID_CODE;
      if ((uint)UVar4 < 0xbf) {
        UVar4 = UVar4 + USCRIPT_INHERITED;
        bVar3 = false;
        do {
          bVar5 = true;
          bVar2 = bVar3;
          if ((!bVar3) && (bVar2 = true, (uint)UVar4 < 0xc0)) {
            bVar5 = (this->bits[(uint)UVar4 >> 5] >> (UVar4 & USCRIPT_ORIYA) & 1) == 0;
            bVar2 = bVar3;
          }
          bVar3 = bVar2;
          UVar1 = UVar4;
        } while ((bVar5) &&
                (UVar4 = UVar4 + USCRIPT_INHERITED, UVar1 = USCRIPT_INVALID_CODE,
                UVar4 != (USCRIPT_MATHEMATICAL_NOTATION|USCRIPT_BLISSYMBOLS)));
      }
      UVar4 = UVar1;
      bVar3 = true;
    } while (USCRIPT_INVALID_CODE < UVar4);
  }
  return dest;
}

Assistant:

UnicodeString &ScriptSet::displayScripts(UnicodeString &dest) const {
    UBool firstTime = TRUE;
    for (int32_t i = nextSetBit(0); i >= 0; i = nextSetBit(i + 1)) {
        if (!firstTime) {
            dest.append((UChar)0x20);
        }
        firstTime = FALSE;
        const char *scriptName = uscript_getShortName((UScriptCode(i)));
        dest.append(UnicodeString(scriptName, -1, US_INV));
    }
    return dest;
}